

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (UnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *this_00;
  float *s;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_01;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar5;
  Scalar *pSVar6;
  long row;
  char *pcVar7;
  long col;
  undefined1 local_210 [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  Matrix<T,_3,_2> P_xy_ref;
  Scalar local_e8;
  Scalar local_e4;
  Scalar local_e0;
  Scalar local_dc;
  Scalar local_d8;
  Scalar local_d4;
  double local_d0;
  undefined1 local_c8 [8];
  Matrix<T,_2,_2> P_yy;
  Vector<float,_2> local_ac;
  Vector<float,_2> mean;
  Matrix<T,_3,_2> K_ref;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  undefined1 local_78 [8];
  Matrix<T,_3,_2> K;
  Scalar local_58;
  Scalar local_54;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_210,1.0,2.0,1.0);
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       (long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
              super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
              m_storage.m_data + 0x14;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  local_78._0_4_ = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
                      ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                              super_StandardBase<Kalman::Vector<float,_3>_>.P.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data + 0x1c),(Scalar *)local_78);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xc);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,(Scalar *)&mean);
  local_c8._0_4_ = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,(Scalar *)local_c8);
  local_50[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,local_50)
  ;
  local_ac.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
            (pCVar1,(Scalar *)&local_ac);
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
             ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c));
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  local_ac.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 2.0;
  local_78._0_4_ = 0x40400000;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       &local_ac;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
             ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c),(Scalar *)local_78);
  this_00 = (CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
            ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                    super_StandardBase<Kalman::Vector<float,_3>_>.P.
                    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
            0x1c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::finished(this_00);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 2.0;
  local_78 = (undefined1  [8])this_00;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_78,
                      sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                      m_storage.m_data.array + 0xc);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,(Scalar *)&mean);
  local_c8._0_4_ = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,(Scalar *)local_c8);
  local_50[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar2,local_50)
  ;
  gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x3f800000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,(Scalar *)&local_38);
  local_54 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,&local_54);
  local_58 = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,&local_58);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 4);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  local_84 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,&local_84);
  local_80 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar2,&local_80);
  local_7c = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar2,&local_7c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_78);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  local_c8._0_4_ = 35.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 34.0;
  local_78 = (undefined1  [8])local_c8;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_78,
                      sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                      m_storage.m_data.array + 0xc);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 34.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar3,(Scalar *)&mean);
  local_50[0] = 46.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,local_50);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_78);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  local_210._0_4_ = 3.0;
  s = sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      + 0xc;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 5.0;
  local_78 = (undefined1  [8])local_210;
  this_01 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_78,s);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 7.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(this_01,(Scalar *)&mean);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_78);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 5.0;
  local_78 = (undefined1  [8])
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_78,s);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,(Scalar *)&mean);
  local_50[0] = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar4,local_50)
  ;
  gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x40400000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,(Scalar *)&local_38);
  local_54 = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_54);
  local_58 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_58);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 7.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 4);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 7.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  local_84 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_84);
  local_80 = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_80);
  local_7c = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_7c);
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 4);
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
       7.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  local_e8 = 11.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_e8);
  local_e4 = 9.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_e4);
  local_e0 = 9.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_e0);
  local_dc = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_dc);
  local_d8 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar4,&local_d8);
  local_d4 = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar4,&local_d4);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_78);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 20.0;
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 20.0;
  local_78 = (undefined1  [8])s;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_78,
                      (Scalar *)&mean);
  local_50[0] = 20.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_(pCVar5,local_50)
  ;
  gtest_ar.message_.ptr_._0_4_ = 0x42200000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar5,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x42200000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar5,(Scalar *)&local_38);
  local_54 = 60.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_(pCVar5,&local_54);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_78);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 0.52863437;
  local_50[0] = 0.04405286;
  local_78 = (undefined1  [8])&mean;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_78,local_50);
  gtest_ar.message_.ptr_._0_4_ = 0xbf781b11;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar5,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x3fcafedf;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar5,(Scalar *)&local_38);
  local_54 = -0.44052863;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                     (pCVar5,&local_54);
  local_58 = 1.6299559;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_(pCVar5,&local_58);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_78);
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  computeKalmanGain<Kalman::Vector<float,_2>_>
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_210,&local_ac,
             (SigmaPoints<Kalman::Vector<float,_2>_> *)
             ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c),(Covariance<Kalman::Vector<float,_2>_> *)local_c8,
             (KalmanGain<Kalman::Vector<float,_2>_> *)local_78);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_38.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_50,"K_ref.rows()","K.rows()",(long *)&gtest_ar.message_,
             (long *)&local_38);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0x82,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    local_38.data_ = (AssertHelperData *)0x2;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_50,"K_ref.cols()","K.cols()",(long *)&gtest_ar.message_,
               (long *)&local_38);
    if (local_50[0]._0_1_ != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      row = 0;
      do {
        if (row == 3) {
          return;
        }
        for (col = 0; col != 2; col = col + 1) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)&mean,row,
                              col);
          local_d0 = (double)*pSVar6;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)local_78,
                              row,col);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_50,"K_ref(i,j)","K(i,j)","1e-6",local_d0,(double)*pSVar6,
                     1e-06);
          if (local_50[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&gtest_ar.message_);
            if (gtest_ar._0_8_ == 0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                       ,0x82,pcVar7);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar.message_);
            goto LAB_00188baa;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
        }
        row = row + 1;
      } while( true );
    }
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0x82,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar.message_);
LAB_00188baa:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename UnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> P_yy;
    P_yy <<
        35, 34,
        34, 46;
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, P_yy, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}